

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

void Am_Fly_Apart_Animator_Do_proc(Am_Object *interp)

{
  Am_Value *pAVar1;
  undefined1 skip_first;
  Am_Value value;
  Am_Object local_28;
  Am_Value local_20;
  
  pAVar1 = Am_Object::Get(interp,0x182,0);
  skip_first = 0;
  Am_Object::Set(interp,0x169,pAVar1,0);
  Am_Object::Am_Object(&local_28,interp);
  Am_Set_Animated_Slots(&local_28);
  Am_Object::~Am_Object(&local_28);
  delete_all_parts(interp);
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = Am_Object::Get(interp,0xc5,1);
  Am_Value::operator=(&value,pAVar1);
  Am_Value::Am_Value(&local_20,&value);
  call_all_commands(&local_20,0xca,interp,(bool)skip_first);
  Am_Value::~Am_Value(&local_20);
  Am_Value::~Am_Value(&value);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Fly_Apart_Animator_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Fly Apart Stop of " << interp);

  // and assert the final visibility value
  interp.Set(Am_VALUE, interp.Get(Am_VALUE_2));
  Am_Set_Animated_Slots(interp);
  delete_all_parts(interp);

  Am_Value value;
  value = interp.Peek(Am_COMMAND);
  call_all_commands(value, Am_DO_METHOD, interp, false);
}